

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableBreakingLogic.cpp
# Opt level: O0

QVector<int> * __thiscall
KDReports::TableBreakingLogic::columnsPerPage
          (QVector<int> *__return_storage_ptr__,TableBreakingLogic *this)

{
  double dVar1;
  qsizetype qVar2;
  const_reference pdVar3;
  reference piVar4;
  long lVar5;
  bool lastPage;
  qreal columnWidth;
  int i_1;
  int pageNumber;
  int columnsInThisPage;
  double local_48;
  qreal currentWidth;
  qreal idealPageWidth;
  double dStack_30;
  int i;
  qreal totalWidth;
  int numColumnsForPage;
  TableBreakingLogic *this_local;
  QVector<int> *columnsForPage;
  
  QList<int>::QList(__return_storage_ptr__);
  if (this->m_pages != 0) {
    qVar2 = QList<double>::count(&this->m_widths);
    dStack_30 = 0.0;
    for (idealPageWidth._4_4_ = 0; idealPageWidth._4_4_ < (int)qVar2;
        idealPageWidth._4_4_ = idealPageWidth._4_4_ + 1) {
      pdVar3 = QList<double>::operator[](&this->m_widths,(long)idealPageWidth._4_4_);
      dStack_30 = *pdVar3 + dStack_30;
    }
    dStack_30 = dStack_30 / (double)this->m_pages;
    local_48 = 0.0;
    QList<int>::resize(__return_storage_ptr__,(long)this->m_pages);
    i_1 = 0;
    columnWidth._4_4_ = 0;
    for (columnWidth._0_4_ = 0; columnWidth._0_4_ < (int)qVar2;
        columnWidth._0_4_ = columnWidth._0_4_ + 1) {
      pdVar3 = QList<double>::operator[](&this->m_widths,(long)columnWidth._0_4_);
      dVar1 = *pdVar3;
      if ((local_48 + dVar1 <= dStack_30) || (columnWidth._4_4_ == this->m_pages + -1)) {
        local_48 = dVar1 + local_48;
        i_1 = i_1 + 1;
      }
      else {
        if ((local_48 + dVar1 < (dStack_30 * 4.0) / 3.0) || ((local_48 == 0.0 && (!NAN(local_48)))))
        {
          i_1 = i_1 + 1;
        }
        else {
          columnWidth._0_4_ = columnWidth._0_4_ + -1;
        }
        lVar5 = (long)columnWidth._4_4_;
        columnWidth._4_4_ = columnWidth._4_4_ + 1;
        piVar4 = QList<int>::operator[](__return_storage_ptr__,lVar5);
        *piVar4 = i_1;
        local_48 = 0.0;
        i_1 = 0;
      }
    }
    if ((columnWidth._4_4_ < this->m_pages) && (0 < i_1)) {
      lVar5 = (long)columnWidth._4_4_;
      columnWidth._4_4_ = columnWidth._4_4_ + 1;
      piVar4 = QList<int>::operator[](__return_storage_ptr__,lVar5);
      *piVar4 = i_1;
    }
    QList<int>::resize(__return_storage_ptr__,(long)columnWidth._4_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

QVector<int> TableBreakingLogic::columnsPerPage() const
{
    QVector<int> columnsForPage;
    if (m_pages == 0)
        return columnsForPage;
    const int numColumnsForPage = m_widths.count();
    qreal totalWidth = 0;
    for (int i = 0; i < numColumnsForPage; ++i) {
        totalWidth += m_widths[i];
    }
    const qreal idealPageWidth = totalWidth / m_pages;
    // qDebug() << "idealPageWidth=" << idealPageWidth;
    qreal currentWidth = 0;
    columnsForPage.resize(m_pages);
    int columnsInThisPage = 0;
    int pageNumber = 0;
    for (int i = 0; i < numColumnsForPage; ++i) {
        const qreal columnWidth = m_widths[i];
        const bool lastPage = pageNumber == m_pages - 1;
        if (currentWidth + columnWidth > idealPageWidth && !lastPage) {
            // Better to include or exclude the column?
            // That's the tricky part. If we exclude too much
            // the last page will be crammed, while if we include
            // a huge column this one might be crammed.
            // Let's have a threshold then: include it if we won't go over-board
            // more than 1/3rd of the page width.
            if (currentWidth + columnWidth < idealPageWidth * 4 / 3 || currentWidth == 0) { // Avoid infinite loop if huge column
                columnsInThisPage += 1;
            } else {
                // current column will be for next page.
                --i;
            }
            columnsForPage[pageNumber++] = columnsInThisPage;

            currentWidth = 0;
            columnsInThisPage = 0;
        } else {
            currentWidth += columnWidth;
            columnsInThisPage += 1;
        }
    }
    if (pageNumber < m_pages && columnsInThisPage > 0) {
        columnsForPage[pageNumber++] = columnsInThisPage;
    }
    columnsForPage.resize(pageNumber);
#ifdef DEBUG_TABLEBREAKINGLOGIC
    qDebug() << "Result of optimized table breaking:" << columnsForPage;
#endif
    return columnsForPage;
}